

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_charset.hpp
# Opt level: O0

escape_value<char,_unsigned_short>
boost::xpressive::detail::
parse_escape<char_const*,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          (char **begin,char *end,
          compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          *tr)

{
  escape_value<char,_unsigned_short> eVar1;
  bool bVar2;
  syntax_option_type sVar3;
  int iVar4;
  regex_traits *end_00;
  char *__last;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_RDX;
  long *in_RDI;
  undefined1 uVar5;
  char *tmp;
  regex_traits *rxtraits;
  bool icase;
  char *in_stack_00000028;
  converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
  converter;
  escape_value<char,_unsigned_short> esc;
  char *in_stack_00000058;
  cpp_regex_traits<char> *in_stack_00000060;
  int in_stack_00000188;
  char_type in_stack_0000018f;
  cpp_regex_traits<char> *in_stack_00000190;
  argument_type in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffb8;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *in_stack_ffffffffffffffc0;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *prVar6;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  result_type local_10;
  undefined7 uStack_f;
  char_class_type local_8;
  undefined2 uStack_6;
  escape_type eStack_4;
  
  ensure_(begin._7_1_,(error_type)begin,end,(char *)tr,in_stack_00000028,(unsigned_long)rxtraits);
  memset(&local_10,0,0x10);
  sVar3 = compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          ::flags(in_RDX);
  sVar3 = regex_constants::operator&(icase_,sVar3);
  uVar5 = sVar3 != ECMAScript;
  end_00 = compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           ::traits(in_RDX);
  local_8 = cpp_regex_traits<char>::lookup_classname<char_const*>
                      (in_stack_00000060,in_stack_00000058,(char *)esc._8_8_,esc.mark_nbr_._3_1_);
  if (local_8 == 0) {
    iVar4 = cpp_regex_traits<char>::value(in_stack_00000190,in_stack_0000018f,in_stack_00000188);
    if (iVar4 == -1) {
      __last = (char *)(ulong)((int)*(char *)*in_RDI - 0x5c);
      switch(__last) {
      case (char *)0x0:
      default:
        local_10 = *(result_type *)*in_RDI;
        *in_RDI = *in_RDI + 1;
        break;
      case (char *)0x5:
        local_10 = '\a';
        *in_RDI = *in_RDI + 1;
        break;
      case (char *)0x7:
        *in_RDI = *in_RDI + 1;
        ensure_(begin._7_1_,(error_type)begin,end,(char *)tr,in_stack_00000028,
                (unsigned_long)rxtraits);
        bVar2 = cpp_regex_traits<char>::in_range('a','z',*(char_type *)*in_RDI);
        uVar5 = true;
        if (!bVar2) {
          uVar5 = cpp_regex_traits<char>::in_range('A','Z',*(char_type *)*in_RDI);
        }
        ensure_(begin._7_1_,(error_type)begin,end,(char *)tr,in_stack_00000028,
                (unsigned_long)rxtraits);
        local_10 = numeric::
                   converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                   ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                                 *)CONCAT17(uVar5,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffac);
        *in_RDI = *in_RDI + 1;
        break;
      case (char *)0x9:
        local_10 = numeric::
                   converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                   ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                                 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffac);
        *in_RDI = *in_RDI + 1;
        break;
      case (char *)0xa:
        local_10 = '\f';
        *in_RDI = *in_RDI + 1;
        break;
      case (char *)0x12:
        local_10 = '\n';
        *in_RDI = *in_RDI + 1;
        break;
      case (char *)0x16:
        local_10 = '\r';
        *in_RDI = *in_RDI + 1;
        break;
      case (char *)0x18:
        local_10 = '\t';
        *in_RDI = *in_RDI + 1;
        break;
      case (char *)0x19:
        *in_RDI = *in_RDI + 1;
        ensure_(begin._7_1_,(error_type)begin,end,(char *)tr,in_stack_00000028,
                (unsigned_long)rxtraits);
        prVar6 = (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)*in_RDI;
        toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                  ((char **)CONCAT17(in_stack_ffffffffffffffd7,
                                     CONCAT16(uVar5,in_stack_ffffffffffffffd0)),(char *)end_00,
                   prVar6,(int)((ulong)__last >> 0x20),(int)__last);
        local_10 = numeric::
                   converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                   ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                                 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffac);
        std::distance<char_const*>((char *)prVar6,__last);
        ensure_(begin._7_1_,(error_type)begin,end,(char *)tr,in_stack_00000028,
                (unsigned_long)rxtraits);
        break;
      case (char *)0x1a:
        local_10 = '\v';
        *in_RDI = *in_RDI + 1;
        break;
      case (char *)0x1c:
        *in_RDI = *in_RDI + 1;
        ensure_(begin._7_1_,(error_type)begin,end,(char *)tr,in_stack_00000028,
                (unsigned_long)rxtraits);
        prVar6 = (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)*in_RDI;
        toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                  ((char **)CONCAT17(in_stack_ffffffffffffffd7,
                                     CONCAT16(uVar5,in_stack_ffffffffffffffd0)),(char *)end_00,
                   prVar6,(int)((ulong)__last >> 0x20),(int)__last);
        local_10 = numeric::
                   converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                   ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                                 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffac);
        std::distance<char_const*>((char *)prVar6,__last);
        ensure_(begin._7_1_,(error_type)begin,end,(char *)tr,in_stack_00000028,
                (unsigned_long)rxtraits);
      }
    }
    else {
      toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                ((char **)CONCAT17(in_stack_ffffffffffffffd7,
                                   CONCAT16(uVar5,in_stack_ffffffffffffffd0)),(char *)end_00,
                 in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                 (int)in_stack_ffffffffffffffb8);
      local_10 = numeric::
                 converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                 ::operator()((converter<int,_unsigned_char,_boost::numeric::conversion_traits<unsigned_char,_int>,_boost::xpressive::detail::char_overflow_handler,_boost::numeric::Trunc<int>,_boost::numeric::raw_converter<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::UseInternalRangeChecker>
                               *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffac);
    }
  }
  else {
    eStack_4 = escape_class;
  }
  eVar1._1_7_ = uStack_f;
  eVar1.ch_ = local_10;
  eVar1.class_ = local_8;
  eVar1._10_2_ = uStack_6;
  eVar1.type_ = eStack_4;
  return eVar1;
}

Assistant:

escape_value<typename iterator_value<FwdIter>::type, typename CompilerTraits::regex_traits::char_class_type>
parse_escape(FwdIter &begin, FwdIter end, CompilerTraits &tr)
{
    using namespace regex_constants;
    typedef typename iterator_value<FwdIter>::type char_type;
    typedef typename CompilerTraits::regex_traits regex_traits;
    typedef typename regex_traits::char_class_type char_class_type;

    // define an unsigned type the same size as char_type
    typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
    BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
    typedef numeric::conversion_traits<uchar_t, int> converstion_traits;

    BOOST_XPR_ENSURE_(begin != end, error_escape, "unexpected end of pattern found");
    numeric::converter<int, uchar_t, converstion_traits, char_overflow_handler> converter;
    escape_value<char_type,char_class_type> esc = { 0, 0, 0, escape_char };
    bool const icase = (0 != (regex_constants::icase_ & tr.flags()));
    regex_traits const &rxtraits = tr.traits();
    FwdIter tmp;

    esc.class_ = rxtraits.lookup_classname(begin, begin + 1, icase);
    if(0 != esc.class_)
    {
        esc.type_ = escape_class;
        return esc;
    }

    if(-1 != rxtraits.value(*begin, 8))
    {
        esc.ch_ = converter(toi(begin, end, rxtraits, 8, 0777));
        return esc;
    }

    switch(*begin)
    {
    // bell character
    case BOOST_XPR_CHAR_(char_type, 'a'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\a');
        ++begin;
        break;
    // escape character
    case BOOST_XPR_CHAR_(char_type, 'e'):
        esc.ch_ = converter(27);
        ++begin;
        break;
    // control character
    case BOOST_XPR_CHAR_(char_type, 'c'):
        BOOST_XPR_ENSURE_(++begin != end, error_escape, "unexpected end of pattern found");
        BOOST_XPR_ENSURE_
        (
            rxtraits.in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *begin)
         || rxtraits.in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *begin)
          , error_escape
          , "invalid escape control letter; must be one of a-z or A-Z"
        );
        // Convert to character according to ECMA-262, section 15.10.2.10:
        esc.ch_ = converter(*begin % 32);
        ++begin;
        break;
    // formfeed character
    case BOOST_XPR_CHAR_(char_type, 'f'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\f');
        ++begin;
        break;
    // newline
    case BOOST_XPR_CHAR_(char_type, 'n'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\n');
        ++begin;
        break;
    // return
    case BOOST_XPR_CHAR_(char_type, 'r'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\r');
        ++begin;
        break;
    // horizontal tab
    case BOOST_XPR_CHAR_(char_type, 't'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\t');
        ++begin;
        break;
    // vertical tab
    case BOOST_XPR_CHAR_(char_type, 'v'):
        esc.ch_ = BOOST_XPR_CHAR_(char_type, '\v');
        ++begin;
        break;
    // hex escape sequence
    case BOOST_XPR_CHAR_(char_type, 'x'):
        BOOST_XPR_ENSURE_(++begin != end, error_escape, "unexpected end of pattern found");
        tmp = begin;
        esc.ch_ = converter(toi(begin, end, rxtraits, 16, 0xff));
        BOOST_XPR_ENSURE_(2 == std::distance(tmp, begin), error_escape, "invalid hex escape : "
            "must be \\x HexDigit HexDigit");
        break;
    // Unicode escape sequence
    case BOOST_XPR_CHAR_(char_type, 'u'):
        BOOST_XPR_ENSURE_(++begin != end, error_escape, "unexpected end of pattern found");
        tmp = begin;
        esc.ch_ = converter(toi(begin, end, rxtraits, 16, 0xffff));
        BOOST_XPR_ENSURE_(4 == std::distance(tmp, begin), error_escape, "invalid Unicode escape : "
            "must be \\u HexDigit HexDigit HexDigit HexDigit");
        break;
    // backslash
    case BOOST_XPR_CHAR_(char_type, '\\'):
        //esc.ch_ = BOOST_XPR_CHAR_(char_type, '\\');
        //++begin;
        //break;
    // all other escaped characters represent themselves
    default:
        esc.ch_ = *begin;
        ++begin;
        break;
    }

    return esc;
}